

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::genRandomBlendState
               (Random *rng,BlendState *blendState)

{
  bool bVar1;
  Vector<bool,_4> local_f8;
  undefined1 local_f4;
  byte local_f3;
  byte local_f2;
  byte local_f1;
  bool alpha_2;
  bool blue;
  bool green;
  BlendFunc BStack_f0;
  bool red;
  BlendFunc local_e8;
  SeparateBlendFunc local_e0;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  local_d0;
  BlendFunc local_b0;
  BlendFunc alpha_1;
  BlendFunc rgb_1;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  local_98;
  SeparateBlendEq local_78;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> local_70;
  BlendEq local_54;
  BlendEq local_50;
  BlendEq alpha;
  BlendEq rgb;
  BlendEq local_3c;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> local_38;
  bool local_19;
  BlendState *local_18;
  BlendState *blendState_local;
  Random *rng_local;
  
  local_18 = blendState;
  blendState_local = (BlendState *)rng;
  bVar1 = de::Random::getBool(rng);
  if (bVar1) {
    local_19 = de::Random::getBool((Random *)blendState_local);
    tcu::Maybe<bool>::operator=(&local_18->enableBlend,&local_19);
  }
  bVar1 = de::Random::getBool((Random *)blendState_local);
  if (bVar1) {
    bVar1 = de::Random::getBool((Random *)blendState_local);
    if (bVar1) {
      local_3c = getRandomBlendEq((Random *)blendState_local);
      tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
      Either(&local_38,&local_3c);
      tcu::
      Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
      ::operator=(&local_18->blendEq,&local_38);
      tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
      ~Either(&local_38);
    }
    else {
      local_50 = getRandomBlendEq((Random *)blendState_local);
      local_54 = getRandomBlendEq((Random *)blendState_local);
      SeparateBlendEq::SeparateBlendEq(&local_78,local_50,local_54);
      tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
      Either(&local_70,&local_78);
      tcu::
      Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
      ::operator=(&local_18->blendEq,&local_70);
      tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
      ~Either(&local_70);
    }
  }
  bVar1 = de::Random::getBool((Random *)blendState_local);
  if (bVar1) {
    bVar1 = de::Random::getBool((Random *)blendState_local);
    if (bVar1) {
      rgb_1 = getRandomBlendFunc((Random *)blendState_local);
      tcu::
      Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
      ::Either(&local_98,&rgb_1);
      tcu::
      Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
      ::operator=(&local_18->blendFunc,&local_98);
      tcu::
      Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
      ::~Either(&local_98);
    }
    else {
      alpha_1 = getRandomBlendFunc((Random *)blendState_local);
      BStack_f0 = getRandomBlendFunc((Random *)blendState_local);
      local_e8 = alpha_1;
      local_b0 = BStack_f0;
      SeparateBlendFunc::SeparateBlendFunc(&local_e0,alpha_1,BStack_f0);
      tcu::
      Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
      ::Either(&local_d0,&local_e0);
      tcu::
      Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
      ::operator=(&local_18->blendFunc,&local_d0);
      tcu::
      Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
      ::~Either(&local_d0);
    }
  }
  bVar1 = de::Random::getBool((Random *)blendState_local);
  if (bVar1) {
    local_f1 = de::Random::getBool((Random *)blendState_local);
    local_f2 = de::Random::getBool((Random *)blendState_local);
    local_f3 = de::Random::getBool((Random *)blendState_local);
    local_f4 = de::Random::getBool((Random *)blendState_local);
    tcu::Vector<bool,_4>::Vector
              (&local_f8,(bool)(local_f1 & 1),(bool)(local_f3 & 1),(bool)(local_f2 & 1),
               (bool)local_f4);
    tcu::Maybe<tcu::Vector<bool,_4>_>::operator=(&local_18->colorMask,&local_f8);
  }
  return;
}

Assistant:

void genRandomBlendState (de::Random& rng, BlendState& blendState)
{
	if (rng.getBool())
		blendState.enableBlend = rng.getBool();

	if (rng.getBool())
	{
		if (rng.getBool())
			blendState.blendEq = getRandomBlendEq(rng);
		else
		{
			const BlendEq	rgb		= getRandomBlendEq(rng);
			const BlendEq	alpha	= getRandomBlendEq(rng);

			blendState.blendEq		= SeparateBlendEq(rgb, alpha);
		}
	}

	if (rng.getBool())
	{
		if (rng.getBool())
			blendState.blendFunc = getRandomBlendFunc(rng);
		else
		{
			const BlendFunc	rgb		= getRandomBlendFunc(rng);
			const BlendFunc	alpha	= getRandomBlendFunc(rng);

			blendState.blendFunc	= SeparateBlendFunc(rgb, alpha);
		}
	}

	if (rng.getBool())
	{
		const bool red		= rng.getBool();
		const bool green	= rng.getBool();
		const bool blue		= rng.getBool();
		const bool alpha	= rng.getBool();

		blendState.colorMask = BVec4(red, blue, green, alpha);
	}
}